

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsq.hpp
# Opt level: O3

void __thiscall tf::TaskQueue<tf::Node_*>::push(TaskQueue<tf::Node_*> *this,Node *o)

{
  pointer *pppAVar1;
  ulong b;
  long t;
  iterator __position;
  Array *pAVar2;
  Array *this_00;
  Array *a;
  __base_type local_30;
  
  b = (this->_bottom).super___atomic_base<long>._M_i;
  t = (this->_top).super___atomic_base<long>._M_i;
  this_00 = (this->_array)._M_b._M_p;
  if (this_00->C <= (long)(b - t)) {
    local_30._M_p = this_00;
    pAVar2 = Array::resize(this_00,b,t);
    __position._M_current =
         (this->_garbage).
         super__Vector_base<tf::TaskQueue<tf::Node_*>::Array_*,_std::allocator<tf::TaskQueue<tf::Node_*>::Array_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->_garbage).
        super__Vector_base<tf::TaskQueue<tf::Node_*>::Array_*,_std::allocator<tf::TaskQueue<tf::Node_*>::Array_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<tf::TaskQueue<tf::Node*>::Array*,std::allocator<tf::TaskQueue<tf::Node*>::Array*>>
      ::_M_realloc_insert<tf::TaskQueue<tf::Node*>::Array*const&>
                ((vector<tf::TaskQueue<tf::Node*>::Array*,std::allocator<tf::TaskQueue<tf::Node*>::Array*>>
                  *)&this->_garbage,__position,&local_30._M_p);
    }
    else {
      *__position._M_current = this_00;
      pppAVar1 = &(this->_garbage).
                  super__Vector_base<tf::TaskQueue<tf::Node_*>::Array_*,_std::allocator<tf::TaskQueue<tf::Node_*>::Array_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppAVar1 = *pppAVar1 + 1;
    }
    (this->_array)._M_b._M_p = pAVar2;
    this_00 = pAVar2;
  }
  this_00->S[this_00->M & b]._M_b._M_p = o;
  (this->_bottom).super___atomic_base<long>._M_i = b + 1;
  return;
}

Assistant:

void TaskQueue<T>::push(T o) {
  //if(auto tmp = _cache.load(std::memory_order_relaxed); tmp) {
  //  uncached_push(tmp);
  //}
  //_cache.store(o, std::memory_order_relaxed);

  int64_t b = _bottom.load(std::memory_order_relaxed);
  int64_t t = _top.load(std::memory_order_acquire);
  Array* a = _array.load(std::memory_order_relaxed);

  // queue is full
  if(a->capacity() - 1 < (b - t)) {
    Array* tmp = a->resize(b, t);
    _garbage.push_back(a);
    std::swap(a, tmp);
    _array.store(a, std::memory_order_release);
    // Note: the original paper using relaxed causes t-san to complain
    //_array.store(a, std::memory_order_relaxed);
  }

  a->push(b, o);
  std::atomic_thread_fence(std::memory_order_release);
  _bottom.store(b + 1, std::memory_order_relaxed);
}